

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PairList.cpp
# Opt level: O0

void __thiscall OpenMD::PairList::addPair(PairList *this,int i,int j)

{
  bool bVar1;
  pair<int,_int> this_00;
  iterator __x;
  int in_EDX;
  int in_ESI;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  *in_RDI;
  iterator iter;
  key_type *in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffc9;
  _Self local_18;
  int local_10;
  int local_c [3];
  
  if (in_ESI != in_EDX) {
    if (in_EDX < in_ESI) {
      std::swap<int>(local_c,&local_10);
    }
    this_00 = std::make_pair<int&,int&>((int *)in_RDI,(int *)0x23ec33);
    local_18._M_node =
         (_Base_ptr)
         std::
         set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
         ::find((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                 *)CONCAT71(in_stack_ffffffffffffffc9,in_stack_ffffffffffffffc8),
                in_stack_ffffffffffffffc0);
    __x = std::
          set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
          ::end(in_RDI);
    bVar1 = std::operator==(&local_18,(_Self *)&stack0xffffffffffffffd8);
    if (bVar1) {
      std::make_pair<int&,int&>((int *)in_RDI,(int *)0x23ec7d);
      std::
      set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
      ::insert((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                *)this_00,(value_type *)__x._M_node);
      *(undefined1 *)&in_RDI[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_left = 1;
    }
  }
  return;
}

Assistant:

void PairList::addPair(int i, int j) {
    if (i == j) {
      return;
    } else if (i > j) {
      std::swap(i, j);
    }

    std::set<std::pair<int, int>>::iterator iter =
        pairSet_.find(std::make_pair(i, j));

    if (iter == pairSet_.end()) {
      pairSet_.insert(std::make_pair(i, j));
      modified_ = true;
    }
  }